

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O2

void sfd_tran_ep_accept(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  nng_err nStack_20;
  
  nni_mtx_lock((nni_mtx *)arg);
  if (*(char *)((long)arg + 0x3a) == '\x01') {
    nni_mtx_unlock((nni_mtx *)arg);
    nStack_20 = NNG_ECLOSED;
  }
  else {
    if (*(long *)((long)arg + 200) == 0) {
      _Var1 = nni_aio_start(aio,sfd_tran_ep_cancel,arg);
      if (_Var1) {
        *(nni_aio **)((long)arg + 200) = aio;
        if (*(char *)((long)arg + 0x39) == '\0') {
          *(undefined1 *)((long)arg + 0x39) = 1;
          nng_stream_listener_accept
                    (*(nng_stream_listener **)((long)arg + 0x2d0),(nng_aio *)((long)arg + 0xd0));
        }
        else {
          sfd_tran_ep_match((sfd_tran_ep *)arg);
        }
      }
      nni_mtx_unlock((nni_mtx *)arg);
      return;
    }
    nni_mtx_unlock((nni_mtx *)arg);
    nStack_20 = NNG_EBUSY;
  }
  nni_aio_finish_error(aio,nStack_20);
  return;
}

Assistant:

static void
sfd_tran_ep_accept(void *arg, nni_aio *aio)
{
	sfd_tran_ep *ep = arg;

	nni_mtx_lock(&ep->mtx);
	if (ep->closed) {
		nni_mtx_unlock(&ep->mtx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
		return;
	}
	if (ep->useraio != NULL) {
		nni_mtx_unlock(&ep->mtx);
		nni_aio_finish_error(aio, NNG_EBUSY);
		return;
	}
	if (!nni_aio_start(aio, sfd_tran_ep_cancel, ep)) {
		nni_mtx_unlock(&ep->mtx);
		return;
	}
	ep->useraio = aio;
	if (!ep->started) {
		ep->started = true;
		nng_stream_listener_accept(ep->listener, &ep->connaio);
	} else {
		sfd_tran_ep_match(ep);
	}
	nni_mtx_unlock(&ep->mtx);
}